

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<WAsmJs::TypedSlotInfo>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,TypedSlotInfo *value)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  undefined8 uVar2;
  BufferBuilder *pBVar3;
  ImmutableList<Js::BufferBuilder_*> *pIVar4;
  
  pBVar3 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x364470);
  pBVar3->clue = clue;
  pBVar3->offset = 0xffffffff;
  pBVar3->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd918;
  uVar2 = *(undefined8 *)&value->tmpCount;
  *(undefined8 *)&pBVar3->field_0x14 = *(undefined8 *)value;
  *(undefined8 *)((long)&pBVar3[1]._vptr_BufferBuilder + 4) = uVar2;
  *(Type *)((long)&pBVar3[1].clue + 4) = value->constSrcByteOffset;
  pBVar3->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014dd8f8;
  pIVar1 = builder->list;
  pIVar4 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x364470);
  pIVar4->value = pBVar3;
  pIVar4->next = pIVar1;
  builder->list = pIVar4;
  return 0x14;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }